

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::InstanceArrayIntersectorKMB<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  AABBNodeMB4D *node1;
  ulong uVar12;
  uint uVar13;
  size_t sVar14;
  Primitive_conflict4 *prim;
  byte bVar15;
  NodeRef *pNVar16;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar17;
  bool bVar18;
  bool bVar19;
  byte bVar20;
  byte bVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  vint4 ai_2;
  undefined1 auVar40 [16];
  undefined1 in_ZMM2 [64];
  vint4 ai;
  undefined1 auVar41 [16];
  vint4 ai_1;
  undefined1 auVar42 [16];
  vint4 ai_3;
  undefined1 auVar43 [16];
  vint4 bi;
  undefined1 auVar44 [16];
  vint4 bi_1;
  undefined1 auVar45 [16];
  vint4 bi_3;
  undefined1 auVar46 [16];
  vint4 bi_2;
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  vbool<4>_conflict valid0;
  InstanceArrayIntersectorKMB<4> local_357a;
  Precalculations pre;
  int local_3528;
  int iStack_3524;
  int iStack_3520;
  int iStack_351c;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    auVar26 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar29 = ZEXT816(0) << 0x40;
    uVar5 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar29,5);
    uVar22 = vpcmpeqd_avx512vl(auVar26,(undefined1  [16])valid_i->field_0);
    uVar22 = ((byte)uVar5 & 0xf) & uVar22;
    bVar20 = (byte)uVar22;
    if (bVar20 != 0) {
      auVar26 = *(undefined1 (*) [16])(ray + 0x40);
      auVar28 = *(undefined1 (*) [16])(ray + 0x50);
      auVar49 = *(undefined1 (*) [16])(ray + 0x60);
      auVar30._8_4_ = 0x7fffffff;
      auVar30._0_8_ = 0x7fffffff7fffffff;
      auVar30._12_4_ = 0x7fffffff;
      auVar23 = vandps_avx(auVar26,auVar30);
      auVar31._8_4_ = 0x219392ef;
      auVar31._0_8_ = 0x219392ef219392ef;
      auVar31._12_4_ = 0x219392ef;
      uVar12 = vcmpps_avx512vl(auVar23,auVar31,1);
      bVar19 = (bool)((byte)uVar12 & 1);
      auVar23._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar26._0_4_;
      bVar19 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar23._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar26._4_4_;
      bVar19 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar23._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar26._8_4_;
      bVar19 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar23._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar26._12_4_;
      auVar26 = vandps_avx(auVar49,auVar30);
      uVar12 = vcmpps_avx512vl(auVar26,auVar31,1);
      bVar19 = (bool)((byte)uVar12 & 1);
      auVar26._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar49._0_4_;
      bVar19 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar26._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar49._4_4_;
      bVar19 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar26._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar49._8_4_;
      bVar19 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar26._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar49._12_4_;
      auVar24 = vrcp14ps_avx512vl(auVar23);
      auVar32._8_4_ = 0x3f800000;
      auVar32._0_8_ = &DAT_3f8000003f800000;
      auVar32._12_4_ = 0x3f800000;
      auVar49 = vfnmadd213ps_fma(auVar23,auVar24,auVar32);
      auVar25 = vrcp14ps_avx512vl(auVar26);
      auVar23 = vfnmadd213ps_fma(auVar26,auVar25,auVar32);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar51 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar26 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar29);
      stack_near[1].field_0._0_4_ =
           (uint)(bVar20 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar20 & 1) * 0x7f800000;
      bVar19 = (bool)((byte)(uVar22 >> 1) & 1);
      stack_near[1].field_0._4_4_ = (uint)bVar19 * auVar26._4_4_ | (uint)!bVar19 * 0x7f800000;
      bVar19 = (bool)((byte)(uVar22 >> 2) & 1);
      stack_near[1].field_0._8_4_ = (uint)bVar19 * auVar26._8_4_ | (uint)!bVar19 * 0x7f800000;
      bVar19 = SUB81(uVar22 >> 3,0);
      stack_near[1].field_0._12_4_ = (uint)bVar19 * auVar26._12_4_ | (uint)!bVar19 * 0x7f800000;
      auVar52 = ZEXT1664((undefined1  [16])stack_near[1].field_0);
      auVar26 = *(undefined1 (*) [16])ray;
      auVar33._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
      auVar33._8_4_ = auVar26._8_4_ ^ 0x80000000;
      auVar33._12_4_ = auVar26._12_4_ ^ 0x80000000;
      auVar26 = *(undefined1 (*) [16])(ray + 0x10);
      auVar34._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
      auVar34._8_4_ = auVar26._8_4_ ^ 0x80000000;
      auVar34._12_4_ = auVar26._12_4_ ^ 0x80000000;
      auVar26 = *(undefined1 (*) [16])(ray + 0x20);
      auVar40._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
      auVar40._8_4_ = auVar26._8_4_ ^ 0x80000000;
      auVar40._12_4_ = auVar26._12_4_ ^ 0x80000000;
      auVar26 = vandps_avx(auVar28,auVar30);
      uVar12 = vcmpps_avx512vl(auVar26,auVar31,1);
      bVar19 = (bool)((byte)uVar12 & 1);
      auVar27._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar28._0_4_;
      bVar19 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar27._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar28._4_4_;
      bVar19 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar27._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar28._8_4_;
      bVar19 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar27._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar28._12_4_;
      auVar28 = vrcp14ps_avx512vl(auVar27);
      auVar26 = vfnmadd213ps_fma(auVar27,auVar28,auVar32);
      auVar26 = vfmadd132ps_fma(auVar26,auVar28,auVar28);
      auVar48 = ZEXT1664(auVar26);
      auVar29 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar29);
      bVar19 = (bool)((byte)(uVar22 >> 1) & 1);
      bVar18 = (bool)((byte)(uVar22 >> 2) & 1);
      bVar3 = SUB81(uVar22 >> 3,0);
      auVar53 = ZEXT1664(CONCAT412((uint)bVar3 * auVar29._12_4_ | (uint)!bVar3 * -0x800000,
                                   CONCAT48((uint)bVar18 * auVar29._8_4_ | (uint)!bVar18 * -0x800000
                                            ,CONCAT44((uint)bVar19 * auVar29._4_4_ |
                                                      (uint)!bVar19 * -0x800000,
                                                      (uint)(bVar20 & 1) * auVar29._0_4_ |
                                                      (uint)!(bool)(bVar20 & 1) * -0x800000))));
      auVar29 = vfmadd132ps_fma(auVar49,auVar24,auVar24);
      auVar47 = ZEXT1664(auVar29);
      auVar28 = vfmadd132ps_fma(auVar23,auVar25,auVar25);
      auVar50 = ZEXT1664(auVar28);
      bVar15 = (byte)((ushort)((short)uVar22 << 0xc) >> 0xc) ^ 0xf;
      pNVar16 = stack_node + 2;
      paVar17 = &stack_near[2].field_0;
      stack_node[0].ptr = 0xfffffffffffffff8;
      auVar29 = vmulps_avx512vl(auVar29,auVar33);
      auVar54 = ZEXT1664(auVar29);
      auVar26 = vmulps_avx512vl(auVar26,auVar34);
      auVar55 = ZEXT1664(auVar26);
      auVar26 = vmulps_avx512vl(auVar28,auVar40);
      auVar56 = ZEXT1664(auVar26);
LAB_0082829d:
      paVar17 = paVar17 + -1;
      sVar14 = pNVar16[-1].ptr;
      pNVar16 = pNVar16 + -1;
      bVar19 = true;
      if (sVar14 != 0xfffffffffffffff8) {
        auVar39 = ZEXT1664((undefined1  [16])*paVar17);
        auVar26 = auVar53._0_16_;
        uVar5 = vcmpps_avx512vl((undefined1  [16])*paVar17,auVar26,1);
        if ((char)uVar5 != '\0') {
          do {
            uVar5 = vcmpps_avx512vl(auVar26,auVar39._0_16_,6);
            uVar13 = (uint)sVar14;
            auVar29 = auVar47._0_16_;
            auVar24 = auVar54._0_16_;
            auVar28 = auVar48._0_16_;
            auVar25 = auVar55._0_16_;
            auVar49 = auVar50._0_16_;
            auVar27 = auVar56._0_16_;
            auVar23 = auVar52._0_16_;
            if ((sVar14 & 8) != 0) {
              if (sVar14 == 0xfffffffffffffff8) goto LAB_0082844e;
              if ((byte)uVar5 != 0) {
                uVar22 = (ulong)(uVar13 & 0xf);
                valid0.v = ~bVar15 & 0xf;
                if (uVar22 == 8) goto LAB_0082851d;
                prim = (Primitive_conflict4 *)(sVar14 & 0xfffffffffffffff0);
                uVar12 = 1;
                goto LAB_008284da;
              }
              break;
            }
            uVar12 = sVar14 & 0xfffffffffffffff0;
            auVar39 = ZEXT1664(auVar51._0_16_);
            uVar22 = 0;
            sVar14 = 8;
            do {
              sVar2 = *(size_t *)(uVar12 + uVar22 * 8);
              if (sVar2 != 8) {
                uVar1 = *(undefined4 *)(uVar12 + 0x100 + uVar22 * 4);
                auVar41._4_4_ = uVar1;
                auVar41._0_4_ = uVar1;
                auVar41._8_4_ = uVar1;
                auVar41._12_4_ = uVar1;
                auVar40 = *(undefined1 (*) [16])(ray + 0x70);
                uVar1 = *(undefined4 *)(uVar12 + 0x40 + uVar22 * 4);
                auVar35._4_4_ = uVar1;
                auVar35._0_4_ = uVar1;
                auVar35._8_4_ = uVar1;
                auVar35._12_4_ = uVar1;
                auVar30 = vfmadd213ps_avx512vl(auVar41,auVar40,auVar35);
                uVar1 = *(undefined4 *)(uVar12 + 0x140 + uVar22 * 4);
                auVar42._4_4_ = uVar1;
                auVar42._0_4_ = uVar1;
                auVar42._8_4_ = uVar1;
                auVar42._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar12 + 0x80 + uVar22 * 4);
                auVar36._4_4_ = uVar1;
                auVar36._0_4_ = uVar1;
                auVar36._8_4_ = uVar1;
                auVar36._12_4_ = uVar1;
                auVar31 = vfmadd213ps_avx512vl(auVar42,auVar40,auVar36);
                uVar1 = *(undefined4 *)(uVar12 + 0x180 + uVar22 * 4);
                auVar43._4_4_ = uVar1;
                auVar43._0_4_ = uVar1;
                auVar43._8_4_ = uVar1;
                auVar43._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar12 + 0xc0 + uVar22 * 4);
                auVar37._4_4_ = uVar1;
                auVar37._0_4_ = uVar1;
                auVar37._8_4_ = uVar1;
                auVar37._12_4_ = uVar1;
                auVar32 = vfmadd213ps_avx512vl(auVar43,auVar40,auVar37);
                uVar1 = *(undefined4 *)(uVar12 + 0x120 + uVar22 * 4);
                auVar44._4_4_ = uVar1;
                auVar44._0_4_ = uVar1;
                auVar44._8_4_ = uVar1;
                auVar44._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar12 + 0x60 + uVar22 * 4);
                auVar38._4_4_ = uVar1;
                auVar38._0_4_ = uVar1;
                auVar38._8_4_ = uVar1;
                auVar38._12_4_ = uVar1;
                auVar33 = vfmadd213ps_avx512vl(auVar44,auVar40,auVar38);
                uVar1 = *(undefined4 *)(uVar12 + 0x160 + uVar22 * 4);
                auVar45._4_4_ = uVar1;
                auVar45._0_4_ = uVar1;
                auVar45._8_4_ = uVar1;
                auVar45._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar12 + 0xa0 + uVar22 * 4);
                auVar8._4_4_ = uVar1;
                auVar8._0_4_ = uVar1;
                auVar8._8_4_ = uVar1;
                auVar8._12_4_ = uVar1;
                auVar34 = vfmadd213ps_avx512vl(auVar45,auVar40,auVar8);
                uVar1 = *(undefined4 *)(uVar12 + 0x1a0 + uVar22 * 4);
                auVar46._4_4_ = uVar1;
                auVar46._0_4_ = uVar1;
                auVar46._8_4_ = uVar1;
                auVar46._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar12 + 0xe0 + uVar22 * 4);
                auVar9._4_4_ = uVar1;
                auVar9._0_4_ = uVar1;
                auVar9._8_4_ = uVar1;
                auVar9._12_4_ = uVar1;
                auVar35 = vfmadd213ps_avx512vl(auVar46,auVar40,auVar9);
                auVar36 = vfmadd213ps_avx512vl(auVar30,auVar29,auVar24);
                auVar37 = vfmadd213ps_avx512vl(auVar31,auVar28,auVar25);
                auVar38 = vfmadd213ps_avx512vl(auVar32,auVar49,auVar27);
                auVar32 = vfmadd213ps_avx512vl(auVar33,auVar29,auVar24);
                auVar33 = vfmadd213ps_avx512vl(auVar34,auVar28,auVar25);
                auVar34 = vfmadd213ps_avx512vl(auVar35,auVar49,auVar27);
                auVar30 = vpminsd_avx(auVar36,auVar32);
                auVar31 = vpminsd_avx(auVar37,auVar33);
                auVar30 = vpmaxsd_avx(auVar30,auVar31);
                auVar31 = vpminsd_avx(auVar38,auVar34);
                auVar30 = vpmaxsd_avx(auVar30,auVar31);
                auVar31 = vpmaxsd_avx(auVar36,auVar32);
                auVar32 = vpmaxsd_avx(auVar37,auVar33);
                auVar33 = vpminsd_avx(auVar31,auVar32);
                auVar31 = vpmaxsd_avx(auVar38,auVar34);
                auVar32 = vpmaxsd_avx(auVar30,auVar23);
                auVar31 = vpminsd_avx512vl(auVar31,auVar26);
                auVar31 = vpminsd_avx(auVar33,auVar31);
                uVar6 = vcmpps_avx512vl(auVar32,auVar31,2);
                bVar21 = (byte)uVar6;
                if ((uVar13 & 7) == 6) {
                  uVar1 = *(undefined4 *)(uVar12 + 0x1e0 + uVar22 * 4);
                  auVar10._4_4_ = uVar1;
                  auVar10._0_4_ = uVar1;
                  auVar10._8_4_ = uVar1;
                  auVar10._12_4_ = uVar1;
                  uVar6 = vcmpps_avx512vl(auVar40,auVar10,1);
                  uVar1 = *(undefined4 *)(uVar12 + 0x1c0 + uVar22 * 4);
                  auVar11._4_4_ = uVar1;
                  auVar11._0_4_ = uVar1;
                  auVar11._8_4_ = uVar1;
                  auVar11._12_4_ = uVar1;
                  uVar7 = vcmpps_avx512vl(auVar40,auVar11,0xd);
                  bVar21 = (byte)uVar6 & (byte)uVar7 & bVar21;
                }
                bVar21 = bVar21 & (byte)uVar5;
                if (bVar21 != 0) {
                  auVar30 = vblendmps_avx512vl(auVar51._0_16_,auVar30);
                  bVar18 = (bool)(bVar21 >> 1 & 1);
                  bVar3 = (bool)(bVar21 >> 2 & 1);
                  bVar4 = (bool)(bVar21 >> 3 & 1);
                  if (sVar14 != 8) {
                    pNVar16->ptr = sVar14;
                    pNVar16 = pNVar16 + 1;
                    *paVar17 = auVar39._0_16_;
                    paVar17 = paVar17 + 1;
                  }
                  auVar39 = ZEXT1664(CONCAT412((uint)bVar4 * auVar30._12_4_ |
                                               (uint)!bVar4 * auVar40._12_4_,
                                               CONCAT48((uint)bVar3 * auVar30._8_4_ |
                                                        (uint)!bVar3 * auVar40._8_4_,
                                                        CONCAT44((uint)bVar18 * auVar30._4_4_ |
                                                                 (uint)!bVar18 * auVar40._4_4_,
                                                                 (uint)(bVar21 & 1) * auVar30._0_4_
                                                                 | (uint)!(bool)(bVar21 & 1) *
                                                                   auVar40._0_4_))));
                  sVar14 = sVar2;
                }
              }
            } while ((sVar2 != 8) && (bVar18 = uVar22 < 7, uVar22 = uVar22 + 1, bVar18));
          } while (sVar14 != 8);
        }
        bVar19 = false;
      }
      goto LAB_0082844e;
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar19 = uVar22 - 8 <= uVar12;
    uVar12 = uVar12 + 1;
    if (bVar19) break;
LAB_008284da:
    InstanceArrayIntersectorKMB<4>::occluded(&local_357a,&valid0,&pre,ray,context,prim);
    valid0.v = ~(byte)local_357a & valid0.v & 0xf;
    if (valid0.v == 0) break;
  }
LAB_0082851d:
  bVar15 = bVar15 | ~valid0.v & 0xf;
  if (bVar15 == 0xf) {
    auVar47 = ZEXT1664(auVar29);
    auVar48 = ZEXT1664(auVar28);
    auVar50 = ZEXT1664(auVar49);
    auVar51 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    auVar52 = ZEXT1664(auVar23);
    auVar53 = ZEXT1664(auVar26);
    auVar54 = ZEXT1664(auVar24);
    auVar55 = ZEXT1664(auVar25);
    auVar56 = ZEXT1664(auVar27);
    bVar19 = true;
  }
  else {
    local_3528 = auVar53._0_4_;
    iStack_3524 = auVar53._4_4_;
    iStack_3520 = auVar53._8_4_;
    iStack_351c = auVar53._12_4_;
    auVar26 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    bVar19 = (bool)(bVar15 >> 1 & 1);
    bVar18 = (bool)(bVar15 >> 2 & 1);
    auVar53 = ZEXT1664(CONCAT412((uint)(bVar15 >> 3) * auVar26._12_4_ |
                                 (uint)!(bool)(bVar15 >> 3) * iStack_351c,
                                 CONCAT48((uint)bVar18 * auVar26._8_4_ | (uint)!bVar18 * iStack_3520
                                          ,CONCAT44((uint)bVar19 * auVar26._4_4_ |
                                                    (uint)!bVar19 * iStack_3524,
                                                    (uint)(bVar15 & 1) * auVar26._0_4_ |
                                                    (uint)!(bool)(bVar15 & 1) * local_3528))));
    bVar19 = false;
    auVar47 = ZEXT1664(auVar29);
    auVar48 = ZEXT1664(auVar28);
    auVar50 = ZEXT1664(auVar49);
    auVar51 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    auVar52 = ZEXT1664(auVar23);
    auVar54 = ZEXT1664(auVar24);
    auVar55 = ZEXT1664(auVar25);
    auVar56 = ZEXT1664(auVar27);
  }
LAB_0082844e:
  if (bVar19) {
    bVar15 = bVar15 & bVar20;
    bVar19 = (bool)(bVar15 >> 1 & 1);
    bVar18 = (bool)(bVar15 >> 2 & 1);
    *(uint *)(ray + 0x80) =
         (uint)(bVar15 & 1) * -0x800000 | (uint)!(bool)(bVar15 & 1) * *(int *)(ray + 0x80);
    *(uint *)(ray + 0x84) = (uint)bVar19 * -0x800000 | (uint)!bVar19 * *(int *)(ray + 0x84);
    *(uint *)(ray + 0x88) = (uint)bVar18 * -0x800000 | (uint)!bVar18 * *(int *)(ray + 0x88);
    *(uint *)(ray + 0x8c) =
         (uint)(bVar15 >> 3) * -0x800000 | (uint)!(bool)(bVar15 >> 3) * *(int *)(ray + 0x8c);
    return;
  }
  goto LAB_0082829d;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }